

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse_time.c
# Opt level: O2

time_t ngx_parse_http_time(u_char *value,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  time_t tVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  uint local_38;
  
  pbVar1 = value + len;
  uVar4 = 0;
  while( true ) {
    bVar13 = value + uVar4 < pbVar1;
    if ((!bVar13) || (bVar2 = value[uVar4], bVar2 == 0x20)) goto LAB_00118138;
    if (bVar2 == 0x2c) break;
    uVar4 = uVar4 + 1;
  }
  bVar13 = false;
LAB_00118138:
  do {
    uVar10 = uVar4;
    pbVar3 = value + uVar10 + 1;
    if (pbVar1 <= pbVar3) break;
    uVar4 = uVar10 + 1;
  } while (*pbVar3 == 0x20);
  tVar5 = -1;
  if ((long)(~uVar10 + len) < 0x12) {
    return -1;
  }
  if (bVar13) {
    iVar7 = 3;
    uVar4 = 0x20;
  }
  else {
    if ((byte)(*pbVar3 - 0x3a) < 0xf6) {
      return -1;
    }
    if ((byte)(value[uVar10 + 2] - 0x3a) < 0xf6) {
      return -1;
    }
    if (value[uVar10 + 3] == '-') {
      iVar7 = 2;
    }
    else {
      if (value[uVar10 + 3] != ' ') {
        return -1;
      }
      if ((long)((len - uVar10) + -3) < 0x12) {
        return -1;
      }
      iVar7 = 1;
    }
    uVar4 = (ulong)((value[uVar10 + 2] - 0x210) + (uint)*pbVar3 * 10);
    pbVar3 = value + uVar10 + 4;
  }
  switch(*pbVar3) {
  case 0x41:
    uVar10 = (ulong)(pbVar3[1] != 0x70) * 4 + 3;
    break;
  default:
    goto switchD_001181ab_caseD_42;
  case 0x44:
    uVar10 = 0xb;
    break;
  case 0x46:
    uVar10 = 1;
    break;
  case 0x4a:
    if (pbVar3[1] == 0x61) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)(pbVar3[2] != 0x6e) + 5;
    }
    break;
  case 0x4d:
    uVar10 = (ulong)(pbVar3[2] != 0x72) * 2 + 2;
    break;
  case 0x4e:
    uVar10 = 10;
    break;
  case 0x4f:
    uVar10 = 9;
    break;
  case 0x53:
    uVar10 = 8;
  }
  if (iVar7 == 2) {
    if (pbVar3[3] != 0x2d) {
      return -1;
    }
    if ((byte)(pbVar3[4] - 0x3a) < 0xf6) {
      return -1;
    }
    if ((byte)(pbVar3[5] - 0x3a) < 0xf6) {
      return -1;
    }
    uVar11 = (pbVar3[5] - 0x210) + (uint)pbVar3[4] * 10;
    uVar9 = (ulong)uVar11 + 0x76c;
    if (uVar11 < 0x46) {
      uVar9 = (ulong)uVar11 + 2000;
    }
    pbVar3 = pbVar3 + 6;
LAB_00118371:
    bVar13 = false;
  }
  else {
    if (iVar7 == 1) {
      if (pbVar3[3] != 0x20) {
        return -1;
      }
      if ((byte)(pbVar3[4] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar3[5] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar3[6] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar3[7] - 0x3a) < 0xf6) {
        return -1;
      }
      uVar9 = (ulong)(((uint)pbVar3[7] +
                      (uint)pbVar3[6] * 10 + (uint)pbVar3[5] * 100 + (uint)pbVar3[4] * 1000) -
                     0xd050);
      pbVar3 = pbVar3 + 8;
      goto LAB_00118371;
    }
    pbVar8 = pbVar3 + 4;
    if (pbVar3[4] == 0x20) {
      pbVar8 = pbVar3 + 5;
    }
    if ((byte)(pbVar3[(ulong)(pbVar3[4] == 0x20) + 4] - 0x3a) < 0xf6) {
      return -1;
    }
    uVar4 = (ulong)(pbVar3[(ulong)(pbVar3[4] == 0x20) + 4] & 0xf);
    bVar2 = pbVar8[1];
    if ((ulong)bVar2 == 0x20) {
      pbVar3 = pbVar8 + 1;
    }
    else {
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        return -1;
      }
      pbVar3 = pbVar8 + 2;
      uVar4 = (uVar4 * 10 + (ulong)bVar2) - 0x30;
    }
    if ((long)pbVar1 - (long)pbVar3 < 0xe) {
      return -1;
    }
    uVar9 = 0x7f6;
    bVar13 = true;
  }
  if ((((((*pbVar3 == 0x20) && (0xf5 < (byte)(pbVar3[1] - 0x3a))) &&
        (0xf5 < (byte)(pbVar3[2] - 0x3a))) &&
       ((pbVar3[3] == 0x3a && (0xf5 < (byte)(pbVar3[4] - 0x3a))))) &&
      ((0xf5 < (byte)(pbVar3[5] - 0x3a) &&
       ((pbVar3[6] == 0x3a && (0xf5 < (byte)(pbVar3[7] - 0x3a))))))) &&
     (0xf5 < (byte)(pbVar3[8] - 0x3a))) {
    if (bVar13) {
      if (pbVar3[9] != 0x20) {
        return -1;
      }
      if ((byte)(pbVar3[10] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar3[0xb] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar3[0xc] - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(pbVar3[0xd] - 0x3a) < 0xf6) {
        return -1;
      }
      local_38 = (uint)pbVar3[0xc];
      uVar9 = (ulong)(((uint)pbVar3[10] * 1000 + local_38 * 10 + (uint)pbVar3[0xb] * 100 +
                      (uint)pbVar3[0xd]) - 0xd050);
    }
    uVar11 = (pbVar3[2] - 0x210) + (uint)pbVar3[1] * 10;
    if (((uVar11 < 0x18) && (uVar12 = (pbVar3[5] - 0x210) + (uint)pbVar3[4] * 10, uVar12 < 0x3c)) &&
       (uVar6 = (pbVar3[8] - 0x210) + (uint)pbVar3[7] * 10, uVar6 < 0x3c)) {
      if ((uVar4 == 0x1d) && ((int)uVar10 == 1)) {
        if ((uVar9 & 3) != 0) {
          return -1;
        }
        if ((uVar9 % 100 == 0) && (uVar9 % 400 != 0)) {
          return -1;
        }
      }
      else if (mday[uVar10] < uVar4) {
        return -1;
      }
      uVar9 = uVar9 - (uVar10 < 2);
      tVar5 = (ulong)uVar12 * 0x3c + (ulong)uVar11 * 0xe10 + (ulong)uVar6 + -0xe794e4080 +
              (((uVar4 + (uVar9 >> 2) + uVar9 * 0x16d +
                ((((ulong)(uVar10 < 2) - 1 | 0xb) + uVar10) * 0x16f) / 0xc) - uVar9 / 100) +
              uVar9 / 400) * 0x15180;
    }
  }
switchD_001181ab_caseD_42:
  return tVar5;
}

Assistant:

time_t
ngx_parse_http_time(u_char *value, size_t len)
{
    u_char      *p, *end;
    ngx_int_t    month;
    ngx_uint_t   day, year, hour, min, sec;
    uint64_t     time;
    enum {
        no = 0,
        rfc822,   /* Tue, 10 Nov 2002 23:50:13   */
        rfc850,   /* Tuesday, 10-Dec-02 23:50:13 */
        isoc      /* Tue Dec 10 23:50:13 2002    */
    } fmt;

    fmt = 0;
    end = value + len;

#if (NGX_SUPPRESS_WARN)
    day = 32;
    year = 2038;
#endif

    for (p = value; p < end; p++) {
        if (*p == ',') {
            break;
        }

        if (*p == ' ') {
            fmt = isoc;
            break;
        }
    }

    for (p++; p < end; p++)
        if (*p != ' ') {
            break;
        }

    if (end - p < 18) {
        return NGX_ERROR;
        }

    if (fmt != isoc) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        day = (*p - '0') * 10 + *(p + 1) - '0';
        p += 2;

        if (*p == ' ') {
            if (end - p < 18) {
                return NGX_ERROR;
            }
            fmt = rfc822;

        } else if (*p == '-') {
            fmt = rfc850;

        } else {
            return NGX_ERROR;
        }

        p++;
    }

    switch (*p) {

    case 'J':
        month = *(p + 1) == 'a' ? 0 : *(p + 2) == 'n' ? 5 : 6;
        break;

    case 'F':
        month = 1;
        break;

    case 'M':
        month = *(p + 2) == 'r' ? 2 : 4;
        break;

    case 'A':
        month = *(p + 1) == 'p' ? 3 : 7;
        break;

    case 'S':
        month = 8;
        break;

    case 'O':
        month = 9;
        break;

    case 'N':
        month = 10;
        break;

    case 'D':
        month = 11;
        break;

    default:
        return NGX_ERROR;
    }

    p += 3;

    if ((fmt == rfc822 && *p != ' ') || (fmt == rfc850 && *p != '-')) {
        return NGX_ERROR;
    }

    p++;

    if (fmt == rfc822) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
        p += 4;

    } else if (fmt == rfc850) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        year = (*p - '0') * 10 + *(p + 1) - '0';
        year += (year < 70) ? 2000 : 1900;
        p += 2;
    }

    if (fmt == isoc) {
        if (*p == ' ') {
            p++;
        }

        if (*p < '0' || *p > '9') {
            return NGX_ERROR;
        }

        day = *p++ - '0';

        if (*p != ' ') {
            if (*p < '0' || *p > '9') {
                return NGX_ERROR;
            }

            day = day * 10 + *p++ - '0';
        }

        if (end - p < 14) {
            return NGX_ERROR;
        }
    }

    if (*p++ != ' ') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    hour = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    min = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    sec = (*p - '0') * 10 + *(p + 1) - '0';

    if (fmt == isoc) {
        p += 2;

        if (*p++ != ' ') {
            return NGX_ERROR;
        }

        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
    }

    if (hour > 23 || min > 59 || sec > 59) {
        return NGX_ERROR;
    }

    if (day == 29 && month == 1) {
        if ((year & 3) || ((year % 100 == 0) && (year % 400) != 0)) {
            return NGX_ERROR;
        }

    } else if (day > mday[month]) {
        return NGX_ERROR;
    }

    /*
     * shift new year to March 1 and start months from 1 (not 0),
     * it is needed for Gauss' formula
     */

    if (--month <= 0) {
        month += 12;
        year -= 1;
    }

    /* Gauss' formula for Gregorian days since March 1, 1 BC */

    time = (uint64_t) (
            /* days in years including leap years since March 1, 1 BC */

            365 * year + year / 4 - year / 100 + year / 400

            /* days before the month */

            + 367 * month / 12 - 30

            /* days before the day */

            + day - 1

            /*
             * 719527 days were between March 1, 1 BC and March 1, 1970,
             * 31 and 28 days were in January and February 1970
             */

            - 719527 + 31 + 28) * 86400 + hour * 3600 + min * 60 + sec;

#if (NGX_TIME_T_SIZE <= 4)

    if (time > 0x7fffffff) {
        return NGX_ERROR;
    }

#endif

    return (time_t) time;
}